

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint __line;
  undefined1 auVar1 [16];
  Iterator IVar2;
  char cVar3;
  int iVar4;
  int *piVar5;
  char *__assertion;
  size_t sVar6;
  int local_6c;
  Vector vector;
  int x;
  int value;
  undefined4 uStack_34;
  undefined8 local_30;
  Iterator end;
  
  puts("TESTING SETUP ...");
  vector.element_size = 0;
  vector.data = (void *)0x0;
  vector.size = 0;
  vector.capacity = 0;
  cVar3 = vector_is_initialized();
  if (cVar3 == '\0') {
    sVar6 = 0;
    vector_setup(&vector,0,4);
    cVar3 = vector_is_initialized(&vector);
    if (cVar3 == '\0') {
      __assertion = "vector_is_initialized(&vector)";
      __line = 0xd;
    }
    else {
      puts("TESTING INSERT ...");
      do {
        local_6c = (int)sVar6;
        if (999 < local_6c) {
          x = 5;
          vector_push_back(&vector,&x);
          vector_insert(&vector,vector.size,&x);
          puts("TESTING ASSIGNMENT ...");
          local_6c = 0;
          goto LAB_00101366;
        }
        iVar4 = vector_insert(&vector,0,&local_6c);
        if (iVar4 != 0) {
          __assertion = "vector_insert(&vector, 0, &i) == VECTOR_SUCCESS";
          __line = 0x12;
          goto LAB_001015b7;
        }
        piVar5 = (int *)vector_get(&vector);
        IVar2.element_size = end.element_size;
        IVar2.pointer = end.pointer;
        auVar1._8_8_ = local_30;
        auVar1._0_8_ = _value;
        if (*piVar5 != local_6c) {
          __assertion = "VECTOR_GET_AS(int, &vector, 0) == i";
          __line = 0x13;
          goto LAB_001015b7;
        }
        sVar6 = (long)*piVar5 + 1;
      } while (vector.size == sVar6);
      __assertion = "vector.size == i + 1";
      __line = 0x14;
      _value = auVar1;
      end = IVar2;
    }
  }
  else {
    __assertion = "!vector_is_initialized(&vector)";
    __line = 0xb;
  }
  goto LAB_001015b7;
LAB_00101366:
  if (vector.size <= (ulong)(long)local_6c) goto LAB_00101397;
  _value = CONCAT44(uStack_34,0x29a);
  iVar4 = vector_assign(&vector,(long)local_6c,&value);
  if (iVar4 != 0) {
    __assertion = "vector_assign(&vector, i, &value) == VECTOR_SUCCESS";
    __line = 0x1f;
    goto LAB_001015b7;
  }
  local_6c = local_6c + 1;
  goto LAB_00101366;
LAB_00101397:
  puts("TESTING ITERATION ...");
  _value = vector_begin(&vector);
  end = (Iterator)vector_end(&vector);
  while( true ) {
    cVar3 = iterator_equals(&value,&end);
    if (cVar3 != '\0') break;
    piVar5 = (int *)iterator_get(&value);
    if (*piVar5 != 0x29a) {
      __assertion = "ITERATOR_GET_AS(int, &iterator) == 666";
      __line = 0x25;
      goto LAB_001015b7;
    }
    iterator_increment(&value);
  }
  puts("TESTING REMOVAL ...");
  do {
    sVar6 = vector.size;
    cVar3 = vector_is_empty(&vector);
    if (cVar3 != '\0') {
      puts("TESTING RESIZE ...");
      iVar4 = vector_resize(&vector,100);
      if (iVar4 == 0) {
        if (vector.size == 100) {
          if (vector.capacity < 0x65) {
            __assertion = "vector.capacity > 100";
            __line = 0x33;
          }
          else {
            puts("TESTING RESERVE ...");
            iVar4 = vector_reserve(&vector,200);
            if (iVar4 == 0) {
              if (vector.size == 100) {
                if (vector.capacity == 200) {
                  puts("TESTING CLEAR ...");
                  iVar4 = vector_clear(&vector);
                  if (iVar4 == 0) {
                    if (vector.size == 0) {
                      cVar3 = vector_is_empty(&vector);
                      if (cVar3 == '\0') {
                        __assertion = "vector_is_empty(&vector)";
                        __line = 0x3e;
                      }
                      else {
                        if (vector.capacity == 1) {
                          vector_destroy(&vector);
                          puts("\x1b[92mALL TEST PASSED\x1b[0m");
                          return 0;
                        }
                        __assertion = "vector.capacity == VECTOR_MINIMUM_CAPACITY";
                        __line = 0x3f;
                      }
                    }
                    else {
                      __assertion = "vector.size == 0";
                      __line = 0x3d;
                    }
                  }
                  else {
                    __assertion = "vector_clear(&vector) == VECTOR_SUCCESS";
                    __line = 0x3b;
                  }
                }
                else {
                  __assertion = "vector.capacity == 200";
                  __line = 0x38;
                }
              }
              else {
                __assertion = "vector.size == 100";
                __line = 0x37;
              }
            }
            else {
              __assertion = "vector_reserve(&vector, 200) == VECTOR_SUCCESS";
              __line = 0x36;
            }
          }
        }
        else {
          __assertion = "vector.size == 100";
          __line = 0x32;
        }
      }
      else {
        __assertion = "vector_resize(&vector, 100) == VECTOR_SUCCESS";
        __line = 0x31;
      }
      goto LAB_001015b7;
    }
    iVar4 = vector_erase(&vector,0);
    if (iVar4 != 0) {
      __assertion = "vector_erase(&vector, 0) == VECTOR_SUCCESS";
      __line = 0x2c;
      goto LAB_001015b7;
    }
  } while (vector.size == sVar6 - 1);
  __assertion = "vector.size == --expected_size";
  __line = 0x2d;
LAB_001015b7:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]router-trie/vector/test/test.c"
                ,__line,"int main(int, const char **)");
}

Assistant:

int main(int argc, const char* argv[]) {
	int i;

	printf("TESTING SETUP ...\n");
	Vector vector = VECTOR_INITIALIZER;
	assert(!vector_is_initialized(&vector));
	vector_setup(&vector, 0, sizeof(int));
	assert(vector_is_initialized(&vector));

	printf("TESTING INSERT ...\n");

	for (i = 0; i < 1000; ++i) {
		assert(vector_insert(&vector, 0, &i) == VECTOR_SUCCESS);
		assert(VECTOR_GET_AS(int, &vector, 0) == i);
		assert(vector.size == i + 1);
	}

	int x = 5;
	vector_push_back(&vector, &x);
	vector_insert(&vector, vector.size, &x);

	printf("TESTING ASSIGNMENT ...\n");

	for (i = 0; i < vector.size; ++i) {
		int value = 666;
		assert(vector_assign(&vector, i, &value) == VECTOR_SUCCESS);
	}

	printf("TESTING ITERATION ...\n");

	VECTOR_FOR_EACH(&vector, iterator) {
		assert(ITERATOR_GET_AS(int, &iterator) == 666);
	}

	printf("TESTING REMOVAL ...\n");

	size_t expected_size = vector.size;
	while (!vector_is_empty(&vector)) {
		assert(vector_erase(&vector, 0) == VECTOR_SUCCESS);
		assert(vector.size == --expected_size);
	}

	printf("TESTING RESIZE ...\n");
	assert(vector_resize(&vector, 100) == VECTOR_SUCCESS);
	assert(vector.size == 100);
	assert(vector.capacity > 100);

	printf("TESTING RESERVE ...\n");
	assert(vector_reserve(&vector, 200) == VECTOR_SUCCESS);
	assert(vector.size == 100);
	assert(vector.capacity == 200);

	printf("TESTING CLEAR ...\n");
	assert(vector_clear(&vector) == VECTOR_SUCCESS);

	assert(vector.size == 0);
	assert(vector_is_empty(&vector));
	assert(vector.capacity == VECTOR_MINIMUM_CAPACITY);

	vector_destroy(&vector);

	printf("\033[92mALL TEST PASSED\033[0m\n");
}